

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O2

ON_BoundingBox * __thiscall
ON_OutlineFigure::BoundingBox(ON_BoundingBox *__return_storage_ptr__,ON_OutlineFigure *this)

{
  ON_OutlineFigurePoint *pOVar1;
  ON_OutlineFigurePoint *pOVar2;
  undefined8 uVar3;
  ON_2fPoint OVar4;
  ON_2fPoint *pOVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  bool bVar11;
  ON__UINT8 OVar12;
  ON__UINT32 OVar13;
  uint uVar14;
  uint uVar15;
  float *pfVar16;
  uint uVar17;
  long lVar18;
  ON__UINT32 j;
  ulong uVar19;
  uint uVar20;
  ON__UINT32 segment_start_dex;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float local_104;
  float local_100;
  float local_fc;
  float local_f4;
  float local_f0;
  float local_ec;
  float local_e8;
  float local_e0;
  ON_2fPoint bbox_cv_max;
  float local_cc;
  float local_c8;
  ON_2fPoint bbox_cv_min;
  ON_OutlineFigurePoint cv [4];
  ON_BoundingBox bez_bbox;
  ON_BezierCurve bez;
  
  OVar12 = this->m_bbox_status;
  if (OVar12 == '\0') {
    this->m_bbox_status = '\a';
    segment_start_dex = 0;
    OVar13 = Internal_FigureEndDex(this,false);
    if (OVar13 != 0) {
      pOVar2 = (this->m_points).m_a;
      local_104 = (pOVar2->m_point).x;
      local_100 = (pOVar2->m_point).y;
      bbox_cv_max = pOVar2->m_point;
      local_f4 = bbox_cv_max.x;
      local_f0 = bbox_cv_max.y;
      local_fc = local_104;
      local_ec = local_f0;
      local_cc = local_f0;
      local_c8 = local_f4;
      bbox_cv_min = bbox_cv_max;
      fVar24 = local_100;
      local_e8 = local_f0;
      local_e0 = local_f4;
      while (segment_start_dex < OVar13) {
        uVar14 = Internal_SegmentDegree(this,segment_start_dex);
        uVar17 = segment_start_dex;
        if (0xfffffffc < uVar14 - 4) {
          fVar23 = pOVar2[uVar14 + segment_start_dex].m_point.x;
          fVar21 = fVar23;
          if ((fVar23 < local_fc) || (fVar21 = local_fc, fVar23 <= local_104)) {
            local_fc = fVar21;
            fVar23 = local_104;
          }
          fVar21 = pOVar2[uVar14 + segment_start_dex].m_point.y;
          fVar25 = fVar21;
          if ((fVar21 < local_100) || (fVar25 = local_100, fVar21 <= fVar24)) {
            local_100 = fVar25;
            fVar21 = fVar24;
          }
          local_104 = fVar23;
          fVar24 = fVar21;
          if (1 < uVar14) {
            uVar17 = segment_start_dex + 1;
            fVar23 = pOVar2[uVar17].m_point.x;
            fVar21 = pOVar2[uVar17].m_point.y;
            if (local_e0 <= fVar23) {
              if (local_f4 < fVar23) {
                bbox_cv_max.x = fVar23;
                local_f4 = fVar23;
              }
            }
            else {
              bbox_cv_min.x = fVar23;
              local_e0 = fVar23;
              local_c8 = fVar23;
            }
            pfVar16 = &bbox_cv_min.y;
            fVar25 = local_e8;
            fVar23 = local_f0;
            fVar22 = fVar21;
            fVar26 = fVar21;
            if ((fVar21 < local_ec) ||
               (pfVar16 = &bbox_cv_max.y, fVar25 = fVar21, fVar23 = fVar21, fVar22 = local_ec,
               fVar26 = local_cc, local_e8 < fVar21)) {
              local_cc = fVar26;
              local_ec = fVar22;
              *pfVar16 = fVar21;
              local_f0 = fVar23;
              local_e8 = fVar25;
            }
            if (uVar14 == 3) {
              uVar17 = segment_start_dex + 2;
              fVar23 = pOVar2[uVar17].m_point.x;
              fVar21 = pOVar2[uVar17].m_point.y;
              if (local_e0 <= fVar23) {
                if (local_f4 < fVar23) {
                  bbox_cv_max.x = fVar23;
                  local_f4 = fVar23;
                }
              }
              else {
                bbox_cv_min.x = fVar23;
                local_e0 = fVar23;
                local_c8 = fVar23;
              }
              pfVar16 = &bbox_cv_min.y;
              fVar23 = local_e8;
              fVar25 = fVar21;
              fVar22 = fVar21;
              fVar26 = local_f0;
              if ((fVar21 < local_ec) ||
                 (pfVar16 = &bbox_cv_max.y, fVar23 = fVar21, fVar25 = local_ec, fVar22 = local_cc,
                 fVar26 = fVar21, local_e8 < fVar21)) {
                local_f0 = fVar26;
                local_cc = fVar22;
                local_ec = fVar25;
                *pfVar16 = fVar21;
                local_e8 = fVar23;
              }
            }
          }
        }
        segment_start_dex = uVar17 + 1;
      }
      if ((((local_c8 < local_fc) || (local_104 < local_f4)) || (local_cc < local_100)) ||
         (fVar24 < local_f0)) {
        lVar18 = 4;
        do {
          *(undefined4 *)((long)cv + lVar18 + -4) = 0;
          *(ON_2fPoint *)(&cv[0].m_point_type + lVar18) = ON_2fPoint::NanPoint;
          lVar18 = lVar18 + 0xc;
        } while (lVar18 != 0x34);
        cv[3].m_point.y = (pOVar2->m_point).y;
        cv[3].m_point_type = pOVar2->m_point_type;
        cv[3].m_point_proximity = pOVar2->m_point_proximity;
        cv[3].m_figure_index = pOVar2->m_figure_index;
        cv[3].m_point.x = (pOVar2->m_point).x;
        uVar19 = 0;
        while (uVar17 = (uint)uVar19, uVar17 < OVar13) {
          uVar14 = Internal_SegmentDegree(this,uVar17);
          if ((uVar14 & 0xfffffffe) == 2) {
            cv[0].m_point.y = pOVar2[uVar19].m_point.y;
            pOVar1 = pOVar2 + uVar19;
            cv[0].m_point_type = pOVar1->m_point_type;
            cv[0].m_point_proximity = pOVar1->m_point_proximity;
            cv[0].m_figure_index = pOVar1->m_figure_index;
            cv[0].m_point.x = (pOVar1->m_point).x;
            uVar15 = uVar17 + 1;
            cv[1].m_point.y = pOVar2[uVar15].m_point.y;
            pOVar1 = pOVar2 + uVar15;
            uVar3._0_1_ = pOVar1->m_point_type;
            uVar3._1_1_ = pOVar1->m_point_proximity;
            uVar3._2_2_ = pOVar1->m_figure_index;
            uVar3._4_4_ = (pOVar1->m_point).x;
            cv[1]._0_4_ = (undefined4)uVar3;
            OVar4.y = cv[1].m_point.y;
            OVar4.x = (float)uVar3._4_4_;
            uVar20 = uVar17 + 2;
            cv[2].m_point.y = pOVar2[uVar20].m_point.y;
            pOVar1 = pOVar2 + uVar20;
            cv[2].m_point_type = pOVar1->m_point_type;
            cv[2].m_point_proximity = pOVar1->m_point_proximity;
            cv[2].m_figure_index = pOVar1->m_figure_index;
            cv[2].m_point.x = (pOVar1->m_point).x;
            fVar23 = cv[1].m_point.y;
            fVar21 = cv[1].m_point.y;
            bbox_cv_max = OVar4;
            bbox_cv_min = OVar4;
            fVar25 = (float)uVar3._4_4_;
            fVar22 = (float)uVar3._4_4_;
            if (uVar14 == 3) {
              if ((float)uVar3._4_4_ <= cv[2].m_point.x) {
                if ((float)uVar3._4_4_ < cv[2].m_point.x) {
                  bbox_cv_max.y = cv[1].m_point.y;
                  bbox_cv_max.x = cv[2].m_point.x;
                  fVar22 = cv[2].m_point.x;
                }
              }
              else {
                bbox_cv_min.y = cv[1].m_point.y;
                bbox_cv_min.x = cv[2].m_point.x;
                fVar25 = cv[2].m_point.x;
              }
              if (cv[1].m_point.y <= cv[2].m_point.y) {
                pOVar5 = &bbox_cv_max;
                fVar26 = cv[2].m_point.y;
                if (cv[1].m_point.y < cv[2].m_point.y) goto LAB_004abdba;
              }
              else {
                pOVar5 = &bbox_cv_min;
                fVar26 = cv[1].m_point.y;
                fVar23 = cv[2].m_point.y;
LAB_004abdba:
                pOVar5->y = cv[2].m_point.y;
                fVar21 = fVar26;
              }
              cv[3].m_point.y = pOVar2[uVar17 + 3].m_point.y;
              pOVar1 = pOVar2 + (uVar17 + 3);
              cv[3].m_point_type = pOVar1->m_point_type;
              cv[3].m_point_proximity = pOVar1->m_point_proximity;
              cv[3].m_figure_index = pOVar1->m_figure_index;
              cv[3].m_point.x = (pOVar1->m_point).x;
              uVar15 = uVar20;
            }
            uVar17 = uVar15;
            cv[1].m_point.x = (float)uVar3._4_4_;
            if (((fVar25 < local_fc) || (local_104 < fVar22)) ||
               ((fVar23 < local_100 || (fVar24 < fVar21)))) {
              ON_BezierCurve::ON_BezierCurve(&bez,3,false,uVar14 + 1);
              pfVar16 = &cv[0].m_point.y;
              for (uVar19 = 0; uVar14 + 1 != uVar19; uVar19 = uVar19 + 1) {
                ON_3dPoint::ON_3dPoint
                          (&bez_bbox.m_min,(double)((ON_2fPoint *)(pfVar16 + -1))->x,
                           (double)*pfVar16,0.0);
                ON_BezierCurve::SetCV(&bez,(int)uVar19,&bez_bbox.m_min);
                pfVar16 = pfVar16 + 3;
              }
              ON_BezierCurve::BoundingBox(&bez_bbox,&bez);
              bVar11 = ON_BoundingBox::IsNotEmpty(&bez_bbox);
              if (((bVar11) && (-1.2343210235867887e+38 < bez_bbox.m_min.x)) &&
                 ((bez_bbox.m_max.x < 1.2343210235867887e+38 &&
                  ((-1.2343210235867887e+38 < bez_bbox.m_min.y &&
                   (bez_bbox.m_max.y < 1.2343210235867887e+38)))))) {
                ON_2fPoint::Set(&bbox_cv_min,(float)bez_bbox.m_min.x,(float)bez_bbox.m_min.y);
                ON_2fPoint::Set(&bbox_cv_max,(float)bez_bbox.m_max.x,(float)bez_bbox.m_max.y);
              }
              ON_BezierCurve::~ON_BezierCurve(&bez);
            }
          }
          uVar19 = (ulong)(uVar17 + 1);
        }
        (this->m_bbox_min).x = local_fc;
        (this->m_bbox_min).y = local_100;
        (this->m_bbox_max).x = local_104;
        (this->m_bbox_max).y = fVar24;
        this->m_bbox_status = '\x01';
        bVar11 = ON_2fPoint::operator==(&this->m_bbox_min,&this->m_bbox_max);
        if (((bVar11) && (this->m_figure_type < 5)) &&
           ((0x13U >> (this->m_figure_type & 0x1f) & 1) != 0)) {
          this->m_figure_type = NotPerimeter;
        }
      }
      else {
        (this->m_bbox_min).x = local_fc;
        (this->m_bbox_min).y = local_100;
        (this->m_bbox_max).x = local_104;
        (this->m_bbox_max).y = fVar24;
        this->m_bbox_status = '\x01';
      }
    }
    OVar12 = this->m_bbox_status;
  }
  dVar10 = ON_BoundingBox::NanBoundingBox.m_max.z;
  dVar9 = ON_BoundingBox::NanBoundingBox.m_max.x;
  dVar8 = ON_BoundingBox::NanBoundingBox.m_min.z;
  dVar7 = ON_BoundingBox::NanBoundingBox.m_min.y;
  dVar6 = ON_BoundingBox::NanBoundingBox.m_min.x;
  if (OVar12 == '\x01') {
    ON_3dPoint::ON_3dPoint((ON_3dPoint *)cv,&this->m_bbox_min);
    ON_3dPoint::ON_3dPoint(&bez_bbox.m_min,&this->m_bbox_max);
    ON_BoundingBox::ON_BoundingBox(__return_storage_ptr__,(ON_3dPoint *)cv,&bez_bbox.m_min);
  }
  else {
    (__return_storage_ptr__->m_max).y = ON_BoundingBox::NanBoundingBox.m_max.y;
    (__return_storage_ptr__->m_max).z = dVar10;
    (__return_storage_ptr__->m_min).z = dVar8;
    (__return_storage_ptr__->m_max).x = dVar9;
    (__return_storage_ptr__->m_min).x = dVar6;
    (__return_storage_ptr__->m_min).y = dVar7;
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_BoundingBox ON_OutlineFigure::BoundingBox() const
{
  while (0 == m_bbox_status)
  {
    m_bbox_status = 7;

    const ON__UINT32 figure_end_dex = Internal_FigureEndDex(false);
    if (0 == figure_end_dex)
      break;

    const ON_OutlineFigurePoint* a = m_points.Array();
    ON_2fPoint bbox_min = a[0].m_point;
    ON_2fPoint bbox_max = bbox_min;
    ON_2fPoint bbox_cv_min = bbox_min;
    ON_2fPoint bbox_cv_max = bbox_max;
    
    for (ON__UINT32 i = 0U; i < figure_end_dex; ++i)
    {
      const ON__UINT32 degree = ON_OutlineFigure::Internal_SegmentDegree(i);
      if (degree < 1U || degree > 3U)
        continue;
      // a[i] = start of bezier (line,quadratic,or cubic)
      ON_OutlineFigurePoint p = a[i+degree]; // p = a[i+degree] = end of bezier (line,quadratic,or cubic)
      Internal_GrowBBox(p.m_point, p.m_point, bbox_min, bbox_max);
      if (degree >= 2U)
      {
        p = a[++i]; // p = 1st interior cv of a quadratic or cubic bezier
        Internal_GrowBBox(p.m_point, p.m_point, bbox_cv_min, bbox_cv_max);
        if (3U == degree)
        {
          p = a[++i]; // p = 2nd interior cv of a cubic bezier
          Internal_GrowBBox(p.m_point, p.m_point, bbox_cv_min, bbox_cv_max);
        }
      }
    }

    if (
      bbox_cv_min.x >= bbox_min.x 
      && bbox_cv_max.x <= bbox_max.x
      && bbox_cv_min.y >= bbox_min.y 
      && bbox_cv_max.y <= bbox_max.y
      )
    {
      // If there were any bezier segments, their control points were inside the bounding box of the segment end points.
      m_bbox_min = bbox_min;
      m_bbox_max = bbox_max;
      m_bbox_status = 1;
      break;
    }

    // get bezeir bounding boxes as needed
    ON_OutlineFigurePoint cv[4];
    cv[3] = a[0]; // to suppress potintial uninitialized memory warning

    for (ON__UINT32 i = 0U; i < figure_end_dex; ++i)
    {
      const ON__UINT32 degree = ON_OutlineFigure::Internal_SegmentDegree(i);
      if (degree < 2U || degree > 3U)
        continue; // correct to continue when degree = 1
      cv[0] = a[i]; // [a[i] = start of quadratic or cubic bezier
      cv[1] = a[++i]; // 1st interior cv of a  quadratic or cubic bezer
      bbox_cv_min = cv[1].m_point;
      bbox_cv_max = bbox_cv_min;
      cv[2] = a[i + 1]; // end of quadratic bezier or penultimate cv of a cubic bezier
      if (3U == degree)
      {
        Internal_GrowBBox(cv[2].m_point, cv[2].m_point, bbox_cv_min, bbox_cv_max);
        ++i;
        cv[3] = a[i + 1]; // end of a cubic bezier
      }

      if (
        bbox_cv_min.x >= bbox_min.x 
        && bbox_cv_max.x <= bbox_max.x
        && bbox_cv_min.y >= bbox_min.y 
        && bbox_cv_max.y <= bbox_max.y
        )
      {
        // the control points of this bezier are inside the current bounding box.
        continue;
      }

      // get tight bounding box of this bezier
      ON_BezierCurve bez(3, false, degree + 1);
      for (ON__UINT32 j = 0; j <= degree; j++)
        bez.SetCV(j, ON_3dPoint(cv[j].m_point.x, cv[j].m_point.y, 0.0));

      const ON_BoundingBox bez_bbox = bez.BoundingBox();
      if (bez_bbox.IsNotEmpty())
      {
        const double minf = ON_UNSET_FLOAT;
        const double maxf = ON_UNSET_POSITIVE_FLOAT;
        if (
          minf < bez_bbox.m_min.x 
          && bez_bbox.m_max.x < maxf
          && minf < bez_bbox.m_min.y 
          && bez_bbox.m_max.y < maxf
          )
        {
          bbox_cv_min.Set((float)bez_bbox.m_min.x, (float)bez_bbox.m_min.y);
          bbox_cv_max.Set((float)bez_bbox.m_max.x, (float)bez_bbox.m_max.y);
        }
      }

      Internal_GrowBBox(bbox_cv_min, bbox_cv_max, bbox_cv_min, bbox_cv_max);
    }

    m_bbox_min = bbox_min;
    m_bbox_max = bbox_max;
    m_bbox_status = 1;
    if (m_bbox_min == m_bbox_max)
    {
      if (
        ON_OutlineFigure::Type::Perimeter == m_figure_type
        || ON_OutlineFigure::Type::Unset == m_figure_type
        || ON_OutlineFigure::Type::Unknown == m_figure_type
        )
      {
        m_figure_type = ON_OutlineFigure::Type::NotPerimeter;
      }
    }
    break;
  }

  if (1 == m_bbox_status)
    return ON_BoundingBox(ON_3dPoint(m_bbox_min), ON_3dPoint(m_bbox_max));

  return ON_BoundingBox::NanBoundingBox;
}